

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCStreamSize(int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ulong uVar2;
  undefined1 in_stack_000000a0 [28];
  ZSTD_compressionParameters cParams;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar2 = 0;
  for (; compressionLevel_00 <= compressionLevel; compressionLevel_00 = compressionLevel_00 + 1) {
    ZSTD_getCParams_internal
              (&cParams,compressionLevel_00,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
    sVar1 = ZSTD_estimateCStreamSize_usingCParams((ZSTD_compressionParameters)in_stack_000000a0);
    if (uVar2 < sVar1) {
      uVar2 = sVar1;
    }
  }
  return uVar2;
}

Assistant:

size_t ZSTD_estimateCStreamSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCStreamSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}